

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall tetgenio::load_var(tetgenio *this,char *filebasename)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  FILE *__stream;
  tetgenio *ptVar4;
  long lVar5;
  double *pdVar6;
  char *pcVar7;
  char *__format;
  char *in_RCX;
  bool bVar8;
  char *pcVar9;
  int iVar10;
  double dVar11;
  char varfilename [1024];
  char inputline [2048];
  tetgenio *local_c48;
  ulong local_c40;
  char local_c38 [4];
  undefined1 auStack_c34 [1020];
  char local_838 [2056];
  
  strcpy(local_c38,filebasename);
  sVar3 = strlen(local_c38);
  builtin_strncpy(local_c38 + sVar3,".var",4);
  auStack_c34[sVar3] = 0;
  __stream = fopen(local_c38,"r");
  if (__stream == (FILE *)0x0) {
    return false;
  }
  pcVar9 = "Opening %s.\n";
  printf("Opening %s.\n",local_c38);
  ptVar4 = (tetgenio *)readnumberline((tetgenio *)pcVar9,local_838,(FILE *)__stream,in_RCX);
  bVar8 = true;
  local_c48 = ptVar4;
  if (ptVar4 == (tetgenio *)0x0) goto LAB_00108e72;
  if ((char)ptVar4->firstnumber == '\0') {
    this->numberoffacetconstraints = 0;
LAB_00108c47:
    bVar8 = true;
    local_c48 = (tetgenio *)readnumberline((tetgenio *)pcVar9,local_838,(FILE *)__stream,in_RCX);
    if (local_c48 == (tetgenio *)0x0) goto LAB_00108e72;
    if ((char)local_c48->firstnumber == '\0') {
      this->numberofsegmentconstraints = 0;
      goto LAB_00108e72;
    }
    local_c40 = 0;
    lVar5 = strtol((char *)local_c48,(char **)&local_c48,0);
    this->numberofsegmentconstraints = (int)lVar5;
    if ((int)lVar5 < 1) goto LAB_00108e72;
    ptVar4 = (tetgenio *)(lVar5 * 0x18 & 0x7fffffff8);
    pdVar6 = (double *)operator_new__((ulong)ptVar4);
    this->segmentconstraintlist = pdVar6;
    lVar5 = 0;
    do {
      ptVar4 = (tetgenio *)readnumberline(ptVar4,local_838,(FILE *)__stream,in_RCX);
      while ((pcVar9 = (char *)(ulong)(byte)ptVar4->firstnumber, (char *)0x2c < pcVar9 ||
             ((0x100900000201U >> ((ulong)pcVar9 & 0x3f) & 1) == 0))) {
        ptVar4 = (tetgenio *)((long)&ptVar4->firstnumber + 1);
      }
LAB_00108cfb:
      bVar1 = (byte)pcVar9;
      if (0x2e < bVar1) {
LAB_00108d12:
        if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_00108d2a;
        pcVar9 = (char *)(ulong)*(byte *)((long)&ptVar4->firstnumber + 1);
        ptVar4 = (tetgenio *)((long)&ptVar4->firstnumber + 1);
        goto LAB_00108cfb;
      }
      in_RCX = pcVar9;
      if ((0x680000000001U >> ((ulong)pcVar9 & 0x3f) & 1) == 0) {
        if (pcVar9 == (char *)0x23) {
          pcVar9 = "Error:  segment constraint %d has no frist endpoint.\n";
          goto LAB_00108e4e;
        }
        goto LAB_00108d12;
      }
      if (bVar1 == 0) {
        pcVar9 = "Error:  segment constraint %d has no frist endpoint.\n";
        local_c48 = ptVar4;
        goto LAB_00108e51;
      }
LAB_00108d2a:
      local_c48 = ptVar4;
      dVar11 = strtod((char *)ptVar4,(char **)&local_c48);
      this->segmentconstraintlist[lVar5] = dVar11;
      ptVar4 = local_c48;
      while ((pcVar9 = (char *)(ulong)(byte)ptVar4->firstnumber, (char *)0x2c < pcVar9 ||
             ((0x100900000201U >> ((ulong)pcVar9 & 0x3f) & 1) == 0))) {
        ptVar4 = (tetgenio *)((long)&ptVar4->firstnumber + 1);
      }
LAB_00108d5d:
      bVar1 = (byte)pcVar9;
      if (0x2e < bVar1) {
LAB_00108d74:
        if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_00108d8c;
        pcVar9 = (char *)(ulong)*(byte *)((long)&ptVar4->firstnumber + 1);
        ptVar4 = (tetgenio *)((long)&ptVar4->firstnumber + 1);
        goto LAB_00108d5d;
      }
      in_RCX = pcVar9;
      if ((0x680000000001U >> ((ulong)pcVar9 & 0x3f) & 1) == 0) {
        if (pcVar9 == (char *)0x23) {
          pcVar9 = "Error:  segment constraint %d has no second endpoint.\n";
          goto LAB_00108e4e;
        }
        goto LAB_00108d74;
      }
      if (bVar1 == 0) {
        pcVar9 = "Error:  segment constraint %d has no second endpoint.\n";
        local_c48 = ptVar4;
        goto LAB_00108e51;
      }
LAB_00108d8c:
      local_c48 = ptVar4;
      dVar11 = strtod((char *)ptVar4,(char **)&local_c48);
      this->segmentconstraintlist[lVar5 + 1] = dVar11;
      ptVar4 = local_c48;
      while ((pcVar9 = (char *)(ulong)(byte)ptVar4->firstnumber, (char *)0x2c < pcVar9 ||
             ((0x100900000201U >> ((ulong)pcVar9 & 0x3f) & 1) == 0))) {
        ptVar4 = (tetgenio *)((long)&ptVar4->firstnumber + 1);
      }
LAB_00108dc0:
      bVar1 = (byte)pcVar9;
      if (bVar1 < 0x2f) {
        in_RCX = pcVar9;
        if ((0x680000000001U >> ((ulong)pcVar9 & 0x3f) & 1) == 0) {
          if (pcVar9 != (char *)0x23) goto LAB_00108dd3;
          pcVar9 = "Error:  segment constraint %d has no maximum length bound.\n";
LAB_00108e4e:
          *(undefined1 *)&ptVar4->firstnumber = 0;
LAB_00108e51:
          printf(pcVar9,(ulong)(uint)(this->firstnumber + (int)local_c40));
          break;
        }
        if (bVar1 == 0) {
          pcVar9 = "Error:  segment constraint %d has no maximum length bound.\n";
          local_c48 = ptVar4;
          goto LAB_00108e51;
        }
      }
      else {
LAB_00108dd3:
        if ((byte)(bVar1 - 0x3a) < 0xf6) goto LAB_00108dba;
      }
      local_c48 = ptVar4;
      dVar11 = strtod((char *)ptVar4,(char **)&local_c48);
      this->segmentconstraintlist[lVar5 + 2] = dVar11;
      lVar5 = lVar5 + 3;
      uVar2 = (int)local_c40 + 1;
      local_c40 = (ulong)uVar2;
    } while ((int)uVar2 < this->numberofsegmentconstraints);
    if (this->numberofsegmentconstraints <= (int)local_c40) goto LAB_00108e72;
  }
  else {
    iVar10 = 0;
    lVar5 = strtol((char *)ptVar4,(char **)&local_c48,0);
    uVar2 = (uint)lVar5;
    this->numberoffacetconstraints = uVar2;
    pcVar9 = (char *)ptVar4;
    if ((int)uVar2 < 1) goto LAB_00108c47;
    pcVar9 = (char *)((ulong)(uVar2 & 0x7fffffff) << 4);
    pdVar6 = (double *)operator_new__((ulong)pcVar9);
    this->facetconstraintlist = pdVar6;
    lVar5 = 0;
    do {
      pcVar9 = readnumberline((tetgenio *)pcVar9,local_838,(FILE *)__stream,in_RCX);
      while ((pcVar7 = (char *)(ulong)(byte)((tetgenio *)pcVar9)->firstnumber, (char *)0x2c < pcVar7
             || ((0x100900000201U >> ((ulong)pcVar7 & 0x3f) & 1) == 0))) {
        pcVar9 = (char *)((long)&((tetgenio *)pcVar9)->firstnumber + 1);
      }
LAB_00108b41:
      bVar1 = (byte)pcVar7;
      if (0x2e < bVar1) {
LAB_00108b58:
        if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_00108b70;
        pcVar7 = (char *)(ulong)*(byte *)((long)&((tetgenio *)pcVar9)->firstnumber + 1);
        pcVar9 = (char *)((long)&((tetgenio *)pcVar9)->firstnumber + 1);
        goto LAB_00108b41;
      }
      in_RCX = pcVar7;
      if ((0x680000000001U >> ((ulong)pcVar7 & 0x3f) & 1) == 0) {
        if (pcVar7 == (char *)0x23) {
          __format = "Error:  facet constraint %d has no facet marker.\n";
          goto LAB_00108c24;
        }
        goto LAB_00108b58;
      }
      if (bVar1 == 0) {
        __format = "Error:  facet constraint %d has no facet marker.\n";
        local_c48 = (tetgenio *)pcVar9;
        goto LAB_00108c27;
      }
LAB_00108b70:
      local_c48 = (tetgenio *)pcVar9;
      dVar11 = strtod(pcVar9,(char **)&local_c48);
      this->facetconstraintlist[lVar5] = dVar11;
      pcVar9 = (char *)local_c48;
      while ((pcVar7 = (char *)(ulong)(byte)((tetgenio *)pcVar9)->firstnumber, (char *)0x2c < pcVar7
             || ((0x100900000201U >> ((ulong)pcVar7 & 0x3f) & 1) == 0))) {
        pcVar9 = (char *)((long)&((tetgenio *)pcVar9)->firstnumber + 1);
      }
LAB_00108ba2:
      bVar1 = (byte)pcVar7;
      if (bVar1 < 0x2f) {
        in_RCX = pcVar7;
        if ((0x680000000001U >> ((ulong)pcVar7 & 0x3f) & 1) == 0) {
          if (pcVar7 != (char *)0x23) goto LAB_00108bb5;
          __format = "Error:  facet constraint %d has no maximum area bound.\n";
LAB_00108c24:
          *(undefined1 *)&((tetgenio *)pcVar9)->firstnumber = 0;
          in_RCX = pcVar7;
LAB_00108c27:
          printf(__format,(ulong)(uint)(this->firstnumber + iVar10));
          pcVar9 = __format;
          break;
        }
        if (bVar1 == 0) {
          __format = "Error:  facet constraint %d has no maximum area bound.\n";
          local_c48 = (tetgenio *)pcVar9;
          goto LAB_00108c27;
        }
      }
      else {
LAB_00108bb5:
        if ((byte)(bVar1 - 0x3a) < 0xf6) goto LAB_00108b9c;
      }
      local_c48 = (tetgenio *)pcVar9;
      dVar11 = strtod(pcVar9,(char **)&local_c48);
      this->facetconstraintlist[lVar5 + 1] = dVar11;
      lVar5 = lVar5 + 2;
      iVar10 = iVar10 + 1;
    } while (iVar10 < this->numberoffacetconstraints);
    if (this->numberoffacetconstraints <= iVar10) goto LAB_00108c47;
  }
  bVar8 = false;
LAB_00108e72:
  fclose(__stream);
  return bVar8;
LAB_00108b9c:
  pcVar7 = (char *)(ulong)*(byte *)((long)&((tetgenio *)pcVar9)->firstnumber + 1);
  pcVar9 = (char *)((long)&((tetgenio *)pcVar9)->firstnumber + 1);
  goto LAB_00108ba2;
LAB_00108dba:
  pcVar9 = (char *)(ulong)*(byte *)((long)&ptVar4->firstnumber + 1);
  ptVar4 = (tetgenio *)((long)&ptVar4->firstnumber + 1);
  goto LAB_00108dc0;
}

Assistant:

bool tetgenio::load_var(char* filebasename)
{
  FILE *infile;
  char varfilename[FILENAMESIZE];
  char inputline[INPUTLINESIZE];
  char *stringptr;
  int index;
  int i;

  // Variant constraints are saved in file "filename.var".
  strcpy(varfilename, filebasename);
  strcat(varfilename, ".var");
  infile = fopen(varfilename, "r");
  if (infile != (FILE *) NULL) {
    printf("Opening %s.\n", varfilename);
  } else {
    return false;
  }

  // Read the facet constraint section.
  stringptr = readnumberline(inputline, infile, varfilename);
  if (stringptr == NULL) {
    // No region list, return.
    fclose(infile);
    return true;
  }
  if (*stringptr != '\0') {
    numberoffacetconstraints = (int) strtol (stringptr, &stringptr, 0);
  } else {
    numberoffacetconstraints = 0;
  }
  if (numberoffacetconstraints > 0) {
    // Initialize 'facetconstraintlist'.
    facetconstraintlist = new REAL[numberoffacetconstraints * 2];
    index = 0;
    for (i = 0; i < numberoffacetconstraints; i++) {
      stringptr = readnumberline(inputline, infile, varfilename);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  facet constraint %d has no facet marker.\n",
               firstnumber + i);
        break;
      } else {
        facetconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  facet constraint %d has no maximum area bound.\n",
               firstnumber + i);
        break;
      } else {
        facetconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
    }
    if (i < numberoffacetconstraints) {
      // This must be caused by an error.
      fclose(infile);
      return false;
    }
  }

  // Read the segment constraint section.
  stringptr = readnumberline(inputline, infile, varfilename);
  if (stringptr == NULL) {
    // No segment list, return.
    fclose(infile);
    return true;
  }
  if (*stringptr != '\0') {
    numberofsegmentconstraints = (int) strtol (stringptr, &stringptr, 0);
  } else {
    numberofsegmentconstraints = 0;
  }
  if (numberofsegmentconstraints > 0) {
    // Initialize 'segmentconstraintlist'.
    segmentconstraintlist = new REAL[numberofsegmentconstraints * 3];
    index = 0;
    for (i = 0; i < numberofsegmentconstraints; i++) {
      stringptr = readnumberline(inputline, infile, varfilename);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no frist endpoint.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no second endpoint.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no maximum length bound.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
    }
    if (i < numberofsegmentconstraints) {
      // This must be caused by an error.
      fclose(infile);
      return false;
    }
  }

  fclose(infile);
  return true;
}